

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O1

FixedFieldInfo * __thiscall
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(ObjTypeSpecFldInfo *this,uint i)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  intptr_t iVar4;
  
  if (((this->m_data).flags & 0x100) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x150,"(HasFixedValue())","HasFixedValue()");
    if (!bVar2) goto LAB_00615bf9;
    *puVar3 = 0;
  }
  if (((this->m_data).flags & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x151,"(IsPoly())","IsPoly()");
    if (!bVar2) goto LAB_00615bf9;
    *puVar3 = 0;
  }
  if ((this->m_data).fixedFieldCount != 0) {
    if ((this->m_data).fixedFieldInfoArraySize <= i) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x154,"(i < m_data.fixedFieldInfoArraySize)",
                         "i < m_data.fixedFieldInfoArraySize");
      if (!bVar2) {
LAB_00615bf9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    iVar4 = FixedFieldInfo::GetFuncInfoAddr
                      ((FixedFieldInfo *)((this->m_data).fixedFieldInfoArray.ptr + i));
    if (iVar4 != 0) {
      return (FixedFieldInfo *)((this->m_data).fixedFieldInfoArray.ptr + i);
    }
  }
  return (FixedFieldInfo *)0x0;
}

Assistant:

FixedFieldInfo *
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(uint i)
{
    Assert(HasFixedValue());
    Assert(IsPoly());
    if (m_data.fixedFieldCount > 0)
    {
        AssertOrFailFast(i < m_data.fixedFieldInfoArraySize);
        if (GetFixedFieldInfoArray()[i].GetFuncInfoAddr() != 0)
        {
            return &GetFixedFieldInfoArray()[i];
        }
    }
    return nullptr;
}